

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O3

bool __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          bool destroy_queue)

{
  undefined1 *puVar1;
  conditional_t<Config::Options_AllocOwnsLocalState,_LocalState,_LocalState_*> *domesticate;
  anon_class_24_1_3fcf651d cb;
  bool bVar2;
  BackendSlabMetadata *meta;
  undefined7 in_register_00000031;
  Alloc<void> p;
  PagemapEntry *entry;
  size_t i;
  long lVar3;
  smallsizeclass_t sizeclass;
  smallsizeclass_t sizeclass_00;
  size_t bytes_flushed;
  size_t local_50;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_48;
  conditional_t<Config::Options_AllocOwnsLocalState,_LocalState,_LocalState_*> *pcStack_40;
  size_t *local_38;
  
  domesticate = &this->backend_state;
  local_50 = 0;
  if ((int)CONCAT71(in_register_00000031,destroy_queue) == 0) {
    while ((this->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
           (this->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      if ((this->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
          (this->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
        handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda()_1_>
                  ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                    *)this);
      }
    }
  }
  else {
    local_38 = &local_50;
    cb.cb.domesticate.local_state = domesticate;
    cb.cb.this = this;
    cb.cb.bytes_flushed = local_38;
    local_48 = this;
    pcStack_40 = domesticate;
    FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul>::
    destroy_and_iterate<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_,snmalloc::RemoteAllocator::destroy_and_iterate<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::flush(bool)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::cap___,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)_1_>
              ((FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul> *)&this->remote_alloc,
               (anon_class_8_1_7a75751d_for_domesticate)domesticate,cb);
  }
  lVar3 = 0;
  do {
    p.unsafe_capptr = (this->super_FastFreeLists).small_fast_free_lists[lVar3].curr.unsafe_capptr;
    if ((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)p.unsafe_capptr !=
        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)0x0) {
      entry = (PagemapEntry *)
              ((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                        ::concretePagemap.body)->
                      super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                      ).super_MetaEntryBase.meta +
              ((ulong)p.unsafe_capptr >> 10 & 0xfffffffffffffff0));
      do {
        (this->super_FastFreeLists).small_fast_free_lists[lVar3].curr.unsafe_capptr =
             *p.unsafe_capptr;
        meta = (BackendSlabMetadata *)
               ((entry->
                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
        *(meta->
         super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
         ).free_queue.end._M_elems[0] = p.unsafe_capptr;
        (meta->
        super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
        ).free_queue.end._M_elems[0] = (void **)p.unsafe_capptr;
        puVar1 = &(meta->
                  super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                  ).free_queue.field_0x12;
        *(short *)puVar1 = *(short *)puVar1 + -1;
        if (*(short *)puVar1 == 0) {
          dealloc_local_object_slow(this,p,entry,meta);
        }
        p.unsafe_capptr =
             (this->super_FastFreeLists).small_fast_free_lists[lVar3].curr.unsafe_capptr;
      } while ((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)p.unsafe_capptr !=
               (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)0x0);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x2b);
  bVar2 = RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
          ::post<9216ul>((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)&this->remote_dealloc_cache,domesticate,(alloc_id_t)&this->remote_alloc)
  ;
  sizeclass_00 = 0;
  do {
    dealloc_local_slabs<true>(this,sizeclass_00);
    sizeclass_00 = sizeclass_00 + 1;
  } while (sizeclass_00 != 0x2b);
  (this->remote_dealloc_cache).capacity = 0;
  return bVar2;
}

Assistant:

bool flush(bool destroy_queue = false)
    {
      auto local_state = backend_state_ptr();
      auto domesticate = [local_state](freelist::QueuePtr p)
                           SNMALLOC_FAST_PATH_LAMBDA {
                             return capptr_domesticate<Config>(local_state, p);
                           };

      size_t bytes_flushed = 0; // Not currently used.

      if (destroy_queue)
      {
        auto cb =
          [this, domesticate, &bytes_flushed](capptr::Alloc<RemoteMessage> m) {
            bool need_post = true; // Always going to post, so ignore.
            const PagemapEntry& entry =
              Config::Backend::get_metaentry(snmalloc::address_cast(m));
            handle_dealloc_remote(
              entry, m, need_post, domesticate, bytes_flushed);
          };

        message_queue().destroy_and_iterate(domesticate, cb);
      }
      else
      {
        // Process incoming message queue
        // Loop as normally only processes a batch
        while (has_messages())
          handle_message_queue([]() {});
      }

      auto& key = freelist::Object::key_root;

      for (size_t i = 0; i < NUM_SMALL_SIZECLASSES; i++)
      {
        if (small_fast_free_lists[i].empty())
          continue;

        // All elements should have the same entry.
        const auto& entry = Config::Backend::get_metaentry(
          address_cast(small_fast_free_lists[i].peek()));
        do
        {
          auto p = small_fast_free_lists[i].take(key, domesticate);
          SNMALLOC_ASSERT(is_start_of_object(
            sizeclass_t::from_small_class(i), address_cast(p)));
          dealloc_local_object(p.as_void(), entry);
        } while (!small_fast_free_lists[i].empty());
      }

      auto posted = remote_dealloc_cache.template post<sizeof(Allocator)>(
        local_state, get_trunc_id());

      // We may now have unused slabs, return to the global allocator.
      for (smallsizeclass_t sizeclass = 0; sizeclass < NUM_SMALL_SIZECLASSES;
           sizeclass++)
      {
        dealloc_local_slabs<true>(sizeclass);
      }

      laden.iterate(
        [domesticate](BackendSlabMetadata* meta) SNMALLOC_FAST_PATH_LAMBDA {
          if (!meta->is_large())
          {
            meta->free_queue.validate(
              freelist::Object::key_root, meta->as_key_tweak(), domesticate);
          }
        });

      // Set the remote_dealloc_cache to immediately slow path.
      remote_dealloc_cache.capacity = 0;

      return posted;
    }